

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  int iVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  byte bVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined4 uVar7;
  undefined1 (*pauVar8) [16];
  uint uVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  undefined1 (*pauVar14) [16];
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  AABBNodeMB4D *node1;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar49 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  uint uVar60;
  uint uVar61;
  uint uVar62;
  undefined1 auVar59 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [64];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  HitK<4> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  long local_2648;
  long local_2640;
  long local_2638;
  ulong local_2630;
  Scene *local_2628;
  undefined1 (*local_2620) [16];
  ulong local_2618;
  RTCFilterFunctionNArguments local_2610;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_2590 [16];
  float local_2580 [4];
  float local_2570 [4];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  float local_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  undefined4 local_24c0;
  undefined4 uStack_24bc;
  undefined4 uStack_24b8;
  undefined4 uStack_24b4;
  undefined1 local_24b0 [16];
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  Scene *pSVar9;
  
  pauVar8 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar45 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar77 = ZEXT3264(CONCAT428(fVar45,CONCAT424(fVar45,CONCAT420(fVar45,CONCAT416(fVar45,CONCAT412(
                                                  fVar45,CONCAT48(fVar45,CONCAT44(fVar45,fVar45)))))
                                               )));
  fVar50 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_23c0._4_4_ = fVar50;
  local_23c0._0_4_ = fVar50;
  local_23c0._8_4_ = fVar50;
  local_23c0._12_4_ = fVar50;
  local_23c0._16_4_ = fVar50;
  local_23c0._20_4_ = fVar50;
  local_23c0._24_4_ = fVar50;
  local_23c0._28_4_ = fVar50;
  auVar44 = ZEXT3264(local_23c0);
  fVar51 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_23e0._4_4_ = fVar51;
  local_23e0._0_4_ = fVar51;
  local_23e0._8_4_ = fVar51;
  local_23e0._12_4_ = fVar51;
  local_23e0._16_4_ = fVar51;
  local_23e0._20_4_ = fVar51;
  local_23e0._24_4_ = fVar51;
  local_23e0._28_4_ = fVar51;
  auVar49 = ZEXT3264(local_23e0);
  fVar45 = fVar45 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar50 = fVar50 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar51 = fVar51 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2618 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar22 = uVar18 ^ 0x20;
  iVar1 = (tray->tfar).field_0.i[k];
  auVar29 = ZEXT3264(CONCAT428(iVar1,CONCAT424(iVar1,CONCAT420(iVar1,CONCAT416(iVar1,CONCAT412(iVar1
                                                  ,CONCAT48(iVar1,CONCAT44(iVar1,iVar1))))))));
  uVar24 = local_2618 ^ 0x20;
  local_2400._0_8_ = CONCAT44(fVar45,fVar45) ^ 0x8000000080000000;
  local_2400._8_4_ = -fVar45;
  local_2400._12_4_ = -fVar45;
  local_2400._16_4_ = -fVar45;
  local_2400._20_4_ = -fVar45;
  local_2400._24_4_ = -fVar45;
  local_2400._28_4_ = -fVar45;
  auVar55 = ZEXT3264(local_2400);
  local_2420._0_8_ = CONCAT44(fVar50,fVar50) ^ 0x8000000080000000;
  local_2420._8_4_ = -fVar50;
  local_2420._12_4_ = -fVar50;
  local_2420._16_4_ = -fVar50;
  local_2420._20_4_ = -fVar50;
  local_2420._24_4_ = -fVar50;
  local_2420._28_4_ = -fVar50;
  auVar59 = ZEXT3264(local_2420);
  local_2440._0_8_ = CONCAT44(fVar51,fVar51) ^ 0x8000000080000000;
  local_2440._8_4_ = -fVar51;
  local_2440._12_4_ = -fVar51;
  local_2440._16_4_ = -fVar51;
  local_2440._20_4_ = -fVar51;
  local_2440._24_4_ = -fVar51;
  local_2440._28_4_ = -fVar51;
  auVar65 = ZEXT3264(local_2440);
  iVar1 = (tray->tnear).field_0.i[k];
  local_2460._4_4_ = iVar1;
  local_2460._0_4_ = iVar1;
  local_2460._8_4_ = iVar1;
  local_2460._12_4_ = iVar1;
  local_2460._16_4_ = iVar1;
  local_2460._20_4_ = iVar1;
  local_2460._24_4_ = iVar1;
  local_2460._28_4_ = iVar1;
  auVar68 = ZEXT3264(local_2460);
  local_2620 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_005cc9db:
  do {
    pauVar23 = pauVar8 + -1;
    pauVar8 = pauVar8 + -1;
    if (*(float *)(*pauVar23 + 8) <= *(float *)(ray + k * 4 + 0x80)) {
      uVar13 = *(ulong *)*pauVar8;
      while ((uVar13 & 8) == 0) {
        uVar19 = uVar13 & 0xfffffffffffffff0;
        uVar7 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar36._4_4_ = uVar7;
        auVar36._0_4_ = uVar7;
        auVar36._8_4_ = uVar7;
        auVar36._12_4_ = uVar7;
        auVar36._16_4_ = uVar7;
        auVar36._20_4_ = uVar7;
        auVar36._24_4_ = uVar7;
        auVar36._28_4_ = uVar7;
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar18),auVar36,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + uVar18));
        auVar54 = auVar55._0_32_;
        auVar30 = vfmadd213ps_fma(ZEXT1632(auVar30),auVar77._0_32_,auVar54);
        auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar21),auVar36,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + uVar21));
        auVar43 = auVar44._0_32_;
        auVar58 = auVar59._0_32_;
        auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar43,auVar58);
        auVar5 = vpmaxsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar37));
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + local_2618),auVar36,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + local_2618));
        auVar48 = auVar49._0_32_;
        auVar64 = auVar65._0_32_;
        auVar30 = vfmadd213ps_fma(ZEXT1632(auVar30),auVar48,auVar64);
        auVar6 = vpmaxsd_avx2(ZEXT1632(auVar30),auVar68._0_32_);
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar22),auVar36,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + uVar22));
        local_25e0 = vpmaxsd_avx2(auVar5,auVar6);
        auVar37 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + (uVar21 ^ 0x20)),auVar36,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + (uVar21 ^ 0x20)));
        auVar30 = vfmadd213ps_fma(ZEXT1632(auVar30),auVar77._0_32_,auVar54);
        auVar37 = vfmadd213ps_fma(ZEXT1632(auVar37),auVar43,auVar58);
        auVar5 = vpminsd_avx2(ZEXT1632(auVar30),ZEXT1632(auVar37));
        auVar30 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar19 + 0x100 + uVar24),auVar36,
                                  *(undefined1 (*) [32])(uVar19 + 0x40 + uVar24));
        auVar30 = vfmadd213ps_fma(ZEXT1632(auVar30),auVar48,auVar64);
        auVar6 = vpminsd_avx2(ZEXT1632(auVar30),auVar29._0_32_);
        auVar5 = vpminsd_avx2(auVar5,auVar6);
        auVar5 = vcmpps_avx(local_25e0,auVar5,2);
        if (((uint)uVar13 & 7) == 6) {
          auVar6 = vcmpps_avx(*(undefined1 (*) [32])(uVar19 + 0x1c0),auVar36,2);
          auVar36 = vcmpps_avx(auVar36,*(undefined1 (*) [32])(uVar19 + 0x1e0),1);
          auVar6 = vandps_avx(auVar6,auVar36);
          auVar5 = vandps_avx(auVar6,auVar5);
          auVar30 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
        }
        else {
          auVar30 = vpackssdw_avx(auVar5._0_16_,auVar5._16_16_);
        }
        auVar30 = vpsllw_avx(auVar30,0xf);
        if ((((((((auVar30 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar30 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar30 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar30 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar30[0xf]
           ) {
          if (pauVar8 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          goto LAB_005cc9db;
        }
        auVar30 = vpacksswb_avx(auVar30,auVar30);
        bVar4 = SUB161(auVar30 >> 7,0) & 1 | (SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar30 >> 0x17,0) & 1) << 2 | (SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar30 >> 0x27,0) & 1) << 4 | (SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar30 >> 0x37,0) & 1) << 6 | SUB161(auVar30 >> 0x3f,0) << 7;
        lVar15 = 0;
        for (uVar13 = (ulong)bVar4; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
          lVar15 = lVar15 + 1;
        }
        uVar13 = *(ulong *)(uVar19 + lVar15 * 8);
        uVar10 = bVar4 - 1 & (uint)bVar4;
        uVar11 = (ulong)uVar10;
        if (uVar10 != 0) {
          uVar60 = *(uint *)(local_25e0 + lVar15 * 4);
          lVar15 = 0;
          for (; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000) {
            lVar15 = lVar15 + 1;
          }
          uVar10 = uVar10 - 1 & uVar10;
          uVar16 = (ulong)uVar10;
          uVar11 = *(ulong *)(uVar19 + lVar15 * 8);
          uVar61 = *(uint *)(local_25e0 + lVar15 * 4);
          if (uVar10 == 0) {
            if (uVar60 < uVar61) {
              *(ulong *)*pauVar8 = uVar11;
              *(uint *)(*pauVar8 + 8) = uVar61;
              pauVar8 = pauVar8 + 1;
            }
            else {
              *(ulong *)*pauVar8 = uVar13;
              *(uint *)(*pauVar8 + 8) = uVar60;
              pauVar8 = pauVar8 + 1;
              uVar13 = uVar11;
            }
          }
          else {
            auVar30._8_8_ = 0;
            auVar30._0_8_ = uVar13;
            auVar30 = vpunpcklqdq_avx(auVar30,ZEXT416(uVar60));
            auVar37._8_8_ = 0;
            auVar37._0_8_ = uVar11;
            auVar37 = vpunpcklqdq_avx(auVar37,ZEXT416(uVar61));
            lVar15 = 0;
            for (; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
              lVar15 = lVar15 + 1;
            }
            uVar10 = uVar10 - 1 & uVar10;
            uVar13 = (ulong)uVar10;
            auVar39._8_8_ = 0;
            auVar39._0_8_ = *(ulong *)(uVar19 + lVar15 * 8);
            auVar31 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_25e0 + lVar15 * 4)));
            auVar39 = vpcmpgtd_avx(auVar37,auVar30);
            if (uVar10 == 0) {
              auVar40 = vpshufd_avx(auVar39,0xaa);
              auVar39 = vblendvps_avx(auVar37,auVar30,auVar40);
              auVar30 = vblendvps_avx(auVar30,auVar37,auVar40);
              auVar37 = vpcmpgtd_avx(auVar31,auVar39);
              auVar40 = vpshufd_avx(auVar37,0xaa);
              auVar37 = vblendvps_avx(auVar31,auVar39,auVar40);
              auVar39 = vblendvps_avx(auVar39,auVar31,auVar40);
              auVar31 = vpcmpgtd_avx(auVar39,auVar30);
              auVar40 = vpshufd_avx(auVar31,0xaa);
              auVar31 = vblendvps_avx(auVar39,auVar30,auVar40);
              auVar30 = vblendvps_avx(auVar30,auVar39,auVar40);
              *pauVar8 = auVar30;
              pauVar8[1] = auVar31;
              uVar13 = auVar37._0_8_;
              pauVar8 = pauVar8 + 2;
            }
            else {
              lVar15 = 0;
              for (; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                lVar15 = lVar15 + 1;
              }
              uVar10 = uVar10 - 1 & uVar10;
              uVar11 = (ulong)uVar10;
              auVar40._8_8_ = 0;
              auVar40._0_8_ = *(ulong *)(uVar19 + lVar15 * 8);
              auVar40 = vpunpcklqdq_avx(auVar40,ZEXT416(*(uint *)(local_25e0 + lVar15 * 4)));
              if (uVar10 == 0) {
                auVar47 = vpshufd_avx(auVar39,0xaa);
                auVar39 = vblendvps_avx(auVar37,auVar30,auVar47);
                auVar30 = vblendvps_avx(auVar30,auVar37,auVar47);
                auVar37 = vpcmpgtd_avx(auVar40,auVar31);
                auVar47 = vpshufd_avx(auVar37,0xaa);
                auVar37 = vblendvps_avx(auVar40,auVar31,auVar47);
                auVar31 = vblendvps_avx(auVar31,auVar40,auVar47);
                auVar40 = vpcmpgtd_avx(auVar31,auVar30);
                auVar47 = vpshufd_avx(auVar40,0xaa);
                auVar40 = vblendvps_avx(auVar31,auVar30,auVar47);
                auVar30 = vblendvps_avx(auVar30,auVar31,auVar47);
                auVar31 = vpcmpgtd_avx(auVar37,auVar39);
                auVar47 = vpshufd_avx(auVar31,0xaa);
                auVar31 = vblendvps_avx(auVar37,auVar39,auVar47);
                auVar37 = vblendvps_avx(auVar39,auVar37,auVar47);
                auVar39 = vpcmpgtd_avx(auVar40,auVar37);
                auVar47 = vpshufd_avx(auVar39,0xaa);
                auVar39 = vblendvps_avx(auVar40,auVar37,auVar47);
                auVar37 = vblendvps_avx(auVar37,auVar40,auVar47);
                *pauVar8 = auVar30;
                pauVar8[1] = auVar37;
                pauVar8[2] = auVar39;
                uVar13 = auVar31._0_8_;
                pauVar23 = pauVar8 + 3;
              }
              else {
                *pauVar8 = auVar30;
                pauVar8[1] = auVar37;
                pauVar8[2] = auVar31;
                pauVar8[3] = auVar40;
                lVar15 = 0x30;
                do {
                  lVar17 = lVar15;
                  lVar15 = 0;
                  for (uVar13 = uVar11; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000
                      ) {
                    lVar15 = lVar15 + 1;
                  }
                  uVar13 = *(ulong *)(uVar19 + lVar15 * 8);
                  auVar31._8_8_ = 0;
                  auVar31._0_8_ = uVar13;
                  auVar30 = vpunpcklqdq_avx(auVar31,ZEXT416(*(uint *)(local_25e0 + lVar15 * 4)));
                  *(undefined1 (*) [16])(pauVar8[1] + lVar17) = auVar30;
                  uVar11 = uVar11 - 1 & uVar11;
                  lVar15 = lVar17 + 0x10;
                } while (uVar11 != 0);
                pauVar23 = (undefined1 (*) [16])(pauVar8[1] + lVar17);
                if (lVar17 + 0x10 != 0) {
                  lVar15 = 0x10;
                  pauVar12 = pauVar8;
                  do {
                    auVar30 = pauVar12[1];
                    pauVar12 = pauVar12 + 1;
                    uVar10 = vextractps_avx(auVar30,2);
                    lVar17 = lVar15;
                    do {
                      if (uVar10 <= *(uint *)(pauVar8[-1] + lVar17 + 8)) {
                        pauVar14 = (undefined1 (*) [16])(*pauVar8 + lVar17);
                        break;
                      }
                      *(undefined1 (*) [16])(*pauVar8 + lVar17) =
                           *(undefined1 (*) [16])(pauVar8[-1] + lVar17);
                      lVar17 = lVar17 + -0x10;
                      pauVar14 = pauVar8;
                    } while (lVar17 != 0);
                    *pauVar14 = auVar30;
                    lVar15 = lVar15 + 0x10;
                  } while (pauVar23 != pauVar12);
                  uVar13 = *(ulong *)*pauVar23;
                }
              }
              auVar44 = ZEXT3264(auVar43);
              auVar49 = ZEXT3264(auVar48);
              auVar55 = ZEXT3264(auVar54);
              auVar59 = ZEXT3264(auVar58);
              auVar65 = ZEXT3264(auVar64);
              auVar68 = ZEXT3264(auVar68._0_32_);
              pauVar8 = pauVar23;
            }
          }
        }
      }
      lVar15 = (ulong)((uint)uVar13 & 0xf) - 8;
      if (lVar15 != 0) {
        uVar13 = uVar13 & 0xfffffffffffffff0;
        lVar17 = 0;
        do {
          lVar20 = lVar17 * 0x140;
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar25._4_4_ = uVar7;
          auVar25._0_4_ = uVar7;
          auVar25._8_4_ = uVar7;
          auVar25._12_4_ = uVar7;
          auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x90 + lVar20),auVar25,
                                    *(undefined1 (*) [16])(uVar13 + lVar20));
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xa0 + lVar20),auVar25,
                                    *(undefined1 (*) [16])(uVar13 + 0x10 + lVar20));
          auVar33 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xb0 + lVar20),auVar25,
                                    *(undefined1 (*) [16])(uVar13 + 0x20 + lVar20));
          auVar30 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xc0 + lVar20),auVar25,
                                    *(undefined1 (*) [16])(uVar13 + 0x30 + lVar20));
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xd0 + lVar20),auVar25,
                                    *(undefined1 (*) [16])(uVar13 + 0x40 + lVar20));
          auVar31 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xe0 + lVar20),auVar25,
                                    *(undefined1 (*) [16])(uVar13 + 0x50 + lVar20));
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0xf0 + lVar20),auVar25,
                                    *(undefined1 (*) [16])(uVar13 + 0x60 + lVar20));
          auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x100 + lVar20),auVar25,
                                    *(undefined1 (*) [16])(uVar13 + 0x70 + lVar20));
          auVar25 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar13 + 0x110 + lVar20),auVar25,
                                    *(undefined1 (*) [16])(uVar13 + 0x80 + lVar20));
          auVar37 = vsubps_avx(auVar38,auVar30);
          auVar30 = vsubps_avx(auVar42,auVar39);
          auVar39 = vsubps_avx(auVar33,auVar31);
          auVar31 = vsubps_avx(auVar40,auVar38);
          auVar40 = vsubps_avx(auVar47,auVar42);
          auVar47 = vsubps_avx(auVar25,auVar33);
          auVar26._0_4_ = auVar47._0_4_ * auVar30._0_4_;
          auVar26._4_4_ = auVar47._4_4_ * auVar30._4_4_;
          auVar26._8_4_ = auVar47._8_4_ * auVar30._8_4_;
          auVar26._12_4_ = auVar47._12_4_ * auVar30._12_4_;
          local_2550 = vfmsub231ps_fma(auVar26,auVar40,auVar39);
          auVar32._0_4_ = auVar39._0_4_ * auVar31._0_4_;
          auVar32._4_4_ = auVar39._4_4_ * auVar31._4_4_;
          auVar32._8_4_ = auVar39._8_4_ * auVar31._8_4_;
          auVar32._12_4_ = auVar39._12_4_ * auVar31._12_4_;
          local_2540 = vfmsub231ps_fma(auVar32,auVar47,auVar37);
          uVar7 = *(undefined4 *)(ray + k * 4);
          auVar69._4_4_ = uVar7;
          auVar69._0_4_ = uVar7;
          auVar69._8_4_ = uVar7;
          auVar69._12_4_ = uVar7;
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar71._4_4_ = uVar7;
          auVar71._0_4_ = uVar7;
          auVar71._8_4_ = uVar7;
          auVar71._12_4_ = uVar7;
          uVar7 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar74._4_4_ = uVar7;
          auVar74._0_4_ = uVar7;
          auVar74._8_4_ = uVar7;
          auVar74._12_4_ = uVar7;
          fVar45 = *(float *)(ray + k * 4 + 0x40);
          auVar63._4_4_ = fVar45;
          auVar63._0_4_ = fVar45;
          auVar63._8_4_ = fVar45;
          auVar63._12_4_ = fVar45;
          auVar38 = vsubps_avx(auVar38,auVar69);
          fVar50 = *(float *)(ray + k * 4 + 0x50);
          auVar70._4_4_ = fVar50;
          auVar70._0_4_ = fVar50;
          auVar70._8_4_ = fVar50;
          auVar70._12_4_ = fVar50;
          auVar42 = vsubps_avx(auVar42,auVar71);
          fVar51 = *(float *)(ray + k * 4 + 0x60);
          auVar72._4_4_ = fVar51;
          auVar72._0_4_ = fVar51;
          auVar72._8_4_ = fVar51;
          auVar72._12_4_ = fVar51;
          auVar33 = vsubps_avx(auVar33,auVar74);
          auVar75._0_4_ = fVar45 * auVar42._0_4_;
          auVar75._4_4_ = fVar45 * auVar42._4_4_;
          auVar75._8_4_ = fVar45 * auVar42._8_4_;
          auVar75._12_4_ = fVar45 * auVar42._12_4_;
          auVar25 = vfmsub231ps_fma(auVar75,auVar38,auVar70);
          auVar66._0_4_ = auVar47._0_4_ * auVar25._0_4_;
          auVar66._4_4_ = auVar47._4_4_ * auVar25._4_4_;
          auVar66._8_4_ = auVar47._8_4_ * auVar25._8_4_;
          auVar66._12_4_ = auVar47._12_4_ * auVar25._12_4_;
          auVar76._0_4_ = auVar39._0_4_ * auVar25._0_4_;
          auVar76._4_4_ = auVar39._4_4_ * auVar25._4_4_;
          auVar76._8_4_ = auVar39._8_4_ * auVar25._8_4_;
          auVar76._12_4_ = auVar39._12_4_ * auVar25._12_4_;
          auVar56._0_4_ = fVar51 * auVar38._0_4_;
          auVar56._4_4_ = fVar51 * auVar38._4_4_;
          auVar56._8_4_ = fVar51 * auVar38._8_4_;
          auVar56._12_4_ = fVar51 * auVar38._12_4_;
          auVar47 = vfmsub231ps_fma(auVar56,auVar33,auVar63);
          auVar39 = vfmadd231ps_fma(auVar66,auVar47,auVar40);
          auVar47 = vfmadd231ps_fma(auVar76,auVar30,auVar47);
          auVar53._0_4_ = auVar40._0_4_ * auVar37._0_4_;
          auVar53._4_4_ = auVar40._4_4_ * auVar37._4_4_;
          auVar53._8_4_ = auVar40._8_4_ * auVar37._8_4_;
          auVar53._12_4_ = auVar40._12_4_ * auVar37._12_4_;
          local_2530 = vfmsub231ps_fma(auVar53,auVar31,auVar30);
          auVar46._0_4_ = fVar50 * auVar33._0_4_;
          auVar46._4_4_ = fVar50 * auVar33._4_4_;
          auVar46._8_4_ = fVar50 * auVar33._8_4_;
          auVar46._12_4_ = fVar50 * auVar33._12_4_;
          auVar25 = vfmsub231ps_fma(auVar46,auVar42,auVar72);
          auVar73._0_4_ = local_2530._0_4_ * fVar51;
          auVar73._4_4_ = local_2530._4_4_ * fVar51;
          auVar73._8_4_ = local_2530._8_4_ * fVar51;
          auVar73._12_4_ = local_2530._12_4_ * fVar51;
          auVar30 = vfmadd231ps_fma(auVar73,local_2540,auVar70);
          auVar40 = vfmadd231ps_fma(auVar30,local_2550,auVar63);
          auVar57._8_4_ = 0x80000000;
          auVar57._0_8_ = 0x8000000080000000;
          auVar57._12_4_ = 0x80000000;
          auVar39 = vfmadd231ps_fma(auVar39,auVar25,auVar31);
          auVar30 = vandps_avx(auVar40,auVar57);
          uVar10 = auVar30._0_4_;
          local_25e0._0_4_ = (float)(uVar10 ^ auVar39._0_4_);
          uVar60 = auVar30._4_4_;
          local_25e0._4_4_ = (float)(uVar60 ^ auVar39._4_4_);
          uVar61 = auVar30._8_4_;
          local_25e0._8_4_ = (float)(uVar61 ^ auVar39._8_4_);
          uVar62 = auVar30._12_4_;
          local_25e0._12_4_ = (float)(uVar62 ^ auVar39._12_4_);
          auVar30 = vfmadd231ps_fma(auVar47,auVar37,auVar25);
          local_25e0._16_4_ = (float)(uVar10 ^ auVar30._0_4_);
          local_25e0._20_4_ = (float)(uVar60 ^ auVar30._4_4_);
          local_25e0._24_4_ = (float)(uVar61 ^ auVar30._8_4_);
          local_25e0._28_4_ = (float)(uVar62 ^ auVar30._12_4_);
          auVar39 = ZEXT816(0) << 0x20;
          auVar30 = vcmpps_avx(local_25e0._0_16_,auVar39,5);
          auVar37 = vcmpps_avx(local_25e0._16_16_,auVar39,5);
          auVar30 = vandps_avx(auVar37,auVar30);
          auVar47._8_4_ = 0x7fffffff;
          auVar47._0_8_ = 0x7fffffff7fffffff;
          auVar47._12_4_ = 0x7fffffff;
          local_25b0 = vandps_avx(auVar40,auVar47);
          auVar37 = vcmpps_avx(auVar40,auVar39,4);
          auVar30 = vandps_avx(auVar30,auVar37);
          auVar67._0_4_ = local_25e0._0_4_ + local_25e0._16_4_;
          auVar67._4_4_ = local_25e0._4_4_ + local_25e0._20_4_;
          auVar67._8_4_ = local_25e0._8_4_ + local_25e0._24_4_;
          auVar67._12_4_ = local_25e0._12_4_ + local_25e0._28_4_;
          auVar37 = vcmpps_avx(auVar67,local_25b0,2);
          auVar39 = auVar37 & auVar30;
          if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar39[0xf] < '\0') {
            auVar30 = vandps_avx(auVar30,auVar37);
            auVar41._0_4_ = local_2530._0_4_ * auVar33._0_4_;
            auVar41._4_4_ = local_2530._4_4_ * auVar33._4_4_;
            auVar41._8_4_ = local_2530._8_4_ * auVar33._8_4_;
            auVar41._12_4_ = local_2530._12_4_ * auVar33._12_4_;
            auVar37 = vfmadd213ps_fma(auVar42,local_2540,auVar41);
            auVar37 = vfmadd213ps_fma(auVar38,local_2550,auVar37);
            local_25c0._0_4_ = (float)(uVar10 ^ auVar37._0_4_);
            local_25c0._4_4_ = (float)(uVar60 ^ auVar37._4_4_);
            local_25c0._8_4_ = (float)(uVar61 ^ auVar37._8_4_);
            local_25c0._12_4_ = (float)(uVar62 ^ auVar37._12_4_);
            fVar45 = *(float *)(ray + k * 4 + 0x30);
            auVar38._0_4_ = local_25b0._0_4_ * fVar45;
            auVar38._4_4_ = local_25b0._4_4_ * fVar45;
            auVar38._8_4_ = local_25b0._8_4_ * fVar45;
            auVar38._12_4_ = local_25b0._12_4_ * fVar45;
            auVar37 = vcmpps_avx(auVar38,local_25c0,1);
            fVar45 = *(float *)(ray + k * 4 + 0x80);
            auVar44 = ZEXT1664(CONCAT412(fVar45,CONCAT48(fVar45,CONCAT44(fVar45,fVar45))));
            auVar42._0_4_ = fVar45 * local_25b0._0_4_;
            auVar42._4_4_ = fVar45 * local_25b0._4_4_;
            auVar42._8_4_ = fVar45 * local_25b0._8_4_;
            auVar42._12_4_ = fVar45 * local_25b0._12_4_;
            auVar39 = vcmpps_avx(local_25c0,auVar42,2);
            auVar37 = vandps_avx(auVar37,auVar39);
            auVar39 = auVar30 & auVar37;
            if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar39[0xf] < '\0') {
              local_2680 = vandps_avx(auVar30,auVar37);
              local_2590 = local_2680;
              pSVar9 = context->scene;
              auVar30 = vrcpps_avx(local_25b0);
              auVar33._8_4_ = 0x3f800000;
              auVar33._0_8_ = 0x3f8000003f800000;
              auVar33._12_4_ = 0x3f800000;
              auVar37 = vfnmadd213ps_fma(local_25b0,auVar30,auVar33);
              auVar30 = vfmadd132ps_fma(auVar37,auVar30,auVar30);
              fVar45 = auVar30._0_4_;
              local_2560._0_4_ = fVar45 * local_25c0._0_4_;
              fVar50 = auVar30._4_4_;
              local_2560._4_4_ = fVar50 * local_25c0._4_4_;
              fVar51 = auVar30._8_4_;
              local_2560._8_4_ = fVar51 * local_25c0._8_4_;
              fVar52 = auVar30._12_4_;
              local_2560._12_4_ = fVar52 * local_25c0._12_4_;
              auVar49 = ZEXT1664(local_2560);
              local_2580[0] = fVar45 * local_25e0._0_4_;
              local_2580[1] = fVar50 * local_25e0._4_4_;
              local_2580[2] = fVar51 * local_25e0._8_4_;
              local_2580[3] = fVar52 * local_25e0._12_4_;
              auVar34._8_4_ = 0x7f800000;
              auVar34._0_8_ = 0x7f8000007f800000;
              auVar34._12_4_ = 0x7f800000;
              auVar30 = vblendvps_avx(auVar34,local_2560,local_2680);
              local_2570[0] = fVar45 * local_25e0._16_4_;
              local_2570[1] = fVar50 * local_25e0._20_4_;
              local_2570[2] = fVar51 * local_25e0._24_4_;
              local_2570[3] = fVar52 * local_25e0._28_4_;
              auVar37 = vshufps_avx(auVar30,auVar30,0xb1);
              auVar37 = vminps_avx(auVar37,auVar30);
              auVar39 = vshufpd_avx(auVar37,auVar37,1);
              auVar37 = vminps_avx(auVar39,auVar37);
              auVar30 = vcmpps_avx(auVar30,auVar37,0);
              auVar39 = local_2680 & auVar30;
              auVar37 = vpcmpeqd_avx(auVar37,auVar37);
              if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar39[0xf] < '\0') {
                auVar37 = auVar30;
              }
              lVar20 = lVar20 + uVar13;
              auVar30 = vandps_avx(local_2680,auVar37);
              auVar55 = ZEXT1664(auVar30);
              local_2628 = pSVar9;
LAB_005cd12f:
              local_2670 = auVar44._0_16_;
              uVar19 = (ulong)pSVar9 >> 0x20;
              uVar7 = vmovmskps_avx(auVar55._0_16_);
              pSVar9 = (Scene *)0x0;
              for (uVar19 = CONCAT44((int)uVar19,uVar7); (uVar19 & 1) == 0;
                  uVar19 = uVar19 >> 1 | 0x8000000000000000) {
                pSVar9 = (Scene *)((long)&(pSVar9->super_AccelN).super_Accel.super_AccelData.
                                          super_RefCount._vptr_RefCount + 1);
              }
              uVar10 = *(uint *)(lVar20 + 0x120 + (long)pSVar9 * 4);
              pGVar2 = (local_2628->geometries).items[uVar10].ptr;
              if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                *(undefined4 *)(local_2680 + (long)pSVar9 * 4) = 0;
              }
              else {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar2->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar45 = local_2580[(long)pSVar9];
                  fVar50 = local_2570[(long)pSVar9];
                  *(undefined4 *)(ray + k * 4 + 0x80) =
                       *(undefined4 *)(local_2560 + (long)pSVar9 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xc0) =
                       *(undefined4 *)(local_2550 + (long)pSVar9 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xd0) =
                       *(undefined4 *)(local_2540 + (long)pSVar9 * 4);
                  *(undefined4 *)(ray + k * 4 + 0xe0) =
                       *(undefined4 *)(local_2530 + (long)pSVar9 * 4);
                  *(float *)(ray + k * 4 + 0xf0) = fVar45;
                  *(float *)(ray + k * 4 + 0x100) = fVar50;
                  *(undefined4 *)(ray + k * 4 + 0x110) =
                       *(undefined4 *)(lVar20 + 0x130 + (long)pSVar9 * 4);
                  *(uint *)(ray + k * 4 + 0x120) = uVar10;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  goto LAB_005ccffe;
                }
                local_2520 = auVar49._0_16_;
                local_2480 = auVar77._0_32_;
                fVar45 = local_2580[(long)pSVar9];
                local_24e0._4_4_ = fVar45;
                local_24e0._0_4_ = fVar45;
                local_24e0._8_4_ = fVar45;
                local_24e0._12_4_ = fVar45;
                local_24d0 = local_2570[(long)pSVar9];
                local_24b0._4_4_ = uVar10;
                local_24b0._0_4_ = uVar10;
                local_24b0._8_4_ = uVar10;
                local_24b0._12_4_ = uVar10;
                local_24c0 = *(undefined4 *)(lVar20 + 0x130 + (long)pSVar9 * 4);
                local_2510 = *(undefined4 *)(local_2550 + (long)pSVar9 * 4);
                uVar7 = *(undefined4 *)(local_2540 + (long)pSVar9 * 4);
                local_2500._4_4_ = uVar7;
                local_2500._0_4_ = uVar7;
                local_2500._8_4_ = uVar7;
                local_2500._12_4_ = uVar7;
                uVar7 = *(undefined4 *)(local_2530 + (long)pSVar9 * 4);
                local_24f0._4_4_ = uVar7;
                local_24f0._0_4_ = uVar7;
                local_24f0._8_4_ = uVar7;
                local_24f0._12_4_ = uVar7;
                uStack_250c = local_2510;
                uStack_2508 = local_2510;
                uStack_2504 = local_2510;
                fStack_24cc = local_24d0;
                fStack_24c8 = local_24d0;
                fStack_24c4 = local_24d0;
                uStack_24bc = local_24c0;
                uStack_24b8 = local_24c0;
                uStack_24b4 = local_24c0;
                vpcmpeqd_avx2(ZEXT1632(local_24e0),ZEXT1632(local_24e0));
                uStack_249c = context->user->instID[0];
                local_24a0 = uStack_249c;
                uStack_2498 = uStack_249c;
                uStack_2494 = uStack_249c;
                uStack_2490 = context->user->instPrimID[0];
                uStack_248c = uStack_2490;
                uStack_2488 = uStack_2490;
                uStack_2484 = uStack_2490;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2560 + (long)pSVar9 * 4)
                ;
                local_2660 = *local_2620;
                local_2610.valid = (int *)local_2660;
                local_2610.geometryUserPtr = pGVar2->userPtr;
                local_2610.context = context->user;
                local_2610.hit = (RTCHitN *)&local_2510;
                local_2610.N = 4;
                local_2648 = lVar20;
                local_2640 = lVar17;
                local_2638 = lVar15;
                local_2630 = uVar18;
                local_2610.ray = (RTCRayN *)ray;
                if (pGVar2->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar2->intersectionFilterN)(&local_2610);
                }
                if (local_2660 == (undefined1  [16])0x0) {
                  auVar30 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                  auVar30 = auVar30 ^ _DAT_01f7ae20;
                }
                else {
                  p_Var3 = context->args->filter;
                  if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    (*p_Var3)(&local_2610);
                  }
                  auVar37 = vpcmpeqd_avx(local_2660,_DAT_01f7aa10);
                  auVar30 = auVar37 ^ _DAT_01f7ae20;
                  if (local_2660 != (undefined1  [16])0x0) {
                    auVar37 = auVar37 ^ _DAT_01f7ae20;
                    auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])local_2610.hit);
                    *(undefined1 (*) [16])(local_2610.ray + 0xc0) = auVar39;
                    auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2610.hit + 0x10));
                    *(undefined1 (*) [16])(local_2610.ray + 0xd0) = auVar39;
                    auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2610.hit + 0x20));
                    *(undefined1 (*) [16])(local_2610.ray + 0xe0) = auVar39;
                    auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2610.hit + 0x30));
                    *(undefined1 (*) [16])(local_2610.ray + 0xf0) = auVar39;
                    auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2610.hit + 0x40));
                    *(undefined1 (*) [16])(local_2610.ray + 0x100) = auVar39;
                    auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2610.hit + 0x50));
                    *(undefined1 (*) [16])(local_2610.ray + 0x110) = auVar39;
                    auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2610.hit + 0x60));
                    *(undefined1 (*) [16])(local_2610.ray + 0x120) = auVar39;
                    auVar39 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2610.hit + 0x70));
                    *(undefined1 (*) [16])(local_2610.ray + 0x130) = auVar39;
                    auVar37 = vmaskmovps_avx(auVar37,*(undefined1 (*) [16])(local_2610.hit + 0x80));
                    *(undefined1 (*) [16])(local_2610.ray + 0x140) = auVar37;
                  }
                }
                auVar27._8_8_ = 0x100000001;
                auVar27._0_8_ = 0x100000001;
                if ((auVar27 & auVar30) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_2670._0_4_;
                }
                else {
                  local_2670 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_2680 + (long)pSVar9 * 4) = 0;
                auVar44 = ZEXT1664(local_2670);
                uVar7 = local_2670._0_4_;
                auVar28._4_4_ = uVar7;
                auVar28._0_4_ = uVar7;
                auVar28._8_4_ = uVar7;
                auVar28._12_4_ = uVar7;
                auVar49 = ZEXT1664(local_2520);
                auVar30 = vcmpps_avx(local_2520,auVar28,2);
                local_2680 = vandps_avx(auVar30,local_2680);
                auVar77 = ZEXT3264(local_2480);
                lVar15 = local_2638;
                lVar17 = local_2640;
                uVar18 = local_2630;
                lVar20 = local_2648;
              }
              auVar55 = ZEXT1664(local_2680);
              if ((((local_2680 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_2680 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_2680 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_2680[0xf]) goto LAB_005ccffe;
              auVar35._8_4_ = 0x7f800000;
              auVar35._0_8_ = 0x7f8000007f800000;
              auVar35._12_4_ = 0x7f800000;
              auVar30 = vblendvps_avx(auVar35,auVar49._0_16_,local_2680);
              auVar37 = vshufps_avx(auVar30,auVar30,0xb1);
              auVar37 = vminps_avx(auVar37,auVar30);
              auVar39 = vshufpd_avx(auVar37,auVar37,1);
              auVar37 = vminps_avx(auVar39,auVar37);
              auVar30 = vcmpps_avx(auVar30,auVar37,0);
              auVar37 = local_2680 & auVar30;
              if ((((auVar37 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar37 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar37 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar37[0xf] < '\0') {
                auVar30 = vandps_avx(auVar30,local_2680);
                auVar55 = ZEXT1664(auVar30);
              }
              goto LAB_005cd12f;
            }
          }
LAB_005ccffe:
          lVar17 = lVar17 + 1;
        } while (lVar17 != lVar15);
      }
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar29 = ZEXT3264(CONCAT428(uVar7,CONCAT424(uVar7,CONCAT420(uVar7,CONCAT416(uVar7,CONCAT412(
                                                  uVar7,CONCAT48(uVar7,CONCAT44(uVar7,uVar7))))))));
      auVar44 = ZEXT3264(local_23c0);
      auVar49 = ZEXT3264(local_23e0);
      auVar55 = ZEXT3264(local_2400);
      auVar59 = ZEXT3264(local_2420);
      auVar65 = ZEXT3264(local_2440);
      auVar68 = ZEXT3264(local_2460);
    }
    if (pauVar8 == (undefined1 (*) [16])&local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }